

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeString::toUTF32
          (UnicodeString *this,UChar32 *utf32,int32_t capacity,UErrorCode *errorCode)

{
  ushort uVar1;
  uint in_EAX;
  char16_t *src;
  int32_t srcLength;
  ulong uStack_8;
  int32_t length32;
  
  uStack_8 = (ulong)in_EAX;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        src = (this->fUnion).fFields.fArray;
      }
      else {
        src = (this->fUnion).fStackFields.fBuffer;
      }
    }
    else {
      src = (char16_t *)0x0;
    }
    if ((short)uVar1 < 0) {
      srcLength = (this->fUnion).fFields.fLength;
    }
    else {
      srcLength = (int)(short)uVar1 >> 5;
    }
    u_strToUTF32WithSub_63(utf32,capacity,&length32,src,srcLength,0xfffd,(int32_t *)0x0,errorCode);
  }
  return length32;
}

Assistant:

int32_t
UnicodeString::toUTF32(UChar32 *utf32, int32_t capacity, UErrorCode &errorCode) const {
  int32_t length32=0;
  if(U_SUCCESS(errorCode)) {
    // getBuffer() and u_strToUTF32WithSub() check for illegal arguments.
    u_strToUTF32WithSub(utf32, capacity, &length32,
        getBuffer(), length(),
        0xfffd,  // Substitution character.
        NULL,    // Don't care about number of substitutions.
        &errorCode);
  }
  return length32;
}